

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O1

void __thiscall BtorSimVCDWriter::update_time(BtorSimVCDWriter *this,int64_t k)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  _Rb_tree_header *p_Var2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  int64_t iVar6;
  bool bVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  _Base_ptr p_Var11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  int64_t local_38;
  
  if (this->current_step < k) {
    local_38 = k;
    if (0 < k) {
      uVar3 = k * 10 - 5;
      uVar15 = -uVar3;
      if (0 < (long)uVar3) {
        uVar15 = uVar3;
      }
      uVar14 = 1;
      if (9 < uVar15) {
        uVar13 = uVar15;
        uVar8 = 4;
        do {
          uVar14 = uVar8;
          if (uVar13 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_0010c7a1;
          }
          if (uVar13 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_0010c7a1;
          }
          if (uVar13 < 10000) goto LAB_0010c7a1;
          bVar7 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          uVar8 = uVar14 + 4;
        } while (bVar7);
        uVar14 = uVar14 + 1;
      }
LAB_0010c7a1:
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_58,(char)uVar14 - (char)((long)uVar3 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_58._M_dataplus._M_p + -((long)uVar3 >> 0x3f),uVar14,uVar15);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x11620c);
      pvVar1 = &this->value_changes;
      paVar4 = &local_78.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_78.field_2._M_allocated_capacity = *psVar12;
        local_78.field_2._8_8_ = plVar9[3];
        local_78._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar12;
        local_78._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_78._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar4) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      p_Var11 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var2) {
        do {
          if (*(int *)&p_Var11[1]._M_parent == 1) {
            get_bv_identifier_abi_cxx11_(&local_58,this,*(int64_t *)(p_Var11 + 1));
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x117c81);
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78.field_2._8_8_ = puVar10[3];
              local_78._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_78._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_78);
LAB_0010c97a:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar4) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
          else if (*(int *)&p_Var11[1]._M_parent == 0) {
            get_bv_identifier_abi_cxx11_(&local_58,this,*(int64_t *)(p_Var11 + 1));
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x117135);
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78.field_2._8_8_ = puVar10[3];
              local_78._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_78._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_78);
            goto LAB_0010c97a;
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var2);
      }
    }
    iVar6 = local_38;
    uVar3 = local_38 * 10;
    uVar15 = local_38 * -10;
    if (0 < (long)uVar3) {
      uVar15 = uVar3;
    }
    uVar14 = 1;
    if (9 < uVar15) {
      uVar13 = uVar15;
      uVar8 = 4;
      do {
        uVar14 = uVar8;
        if (uVar13 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0010ca27;
        }
        if (uVar13 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0010ca27;
        }
        if (uVar13 < 10000) goto LAB_0010ca27;
        bVar7 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        uVar8 = uVar14 + 4;
      } while (bVar7);
      uVar14 = uVar14 + 1;
    }
LAB_0010ca27:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar14 - (char)((long)uVar3 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_58._M_dataplus._M_p + -((long)uVar3 >> 0x3f),uVar14,uVar15);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x11620c);
    pvVar1 = &this->value_changes;
    paVar4 = &local_78.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_78.field_2._M_allocated_capacity = *psVar12;
      local_78.field_2._8_8_ = plVar9[3];
      local_78._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar12;
      local_78._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_78._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,&local_78
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar4) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    this->current_step = iVar6;
    p_Var11 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var2) {
      do {
        iVar6 = *(int64_t *)(p_Var11 + 1);
        iVar5 = *(int *)&p_Var11[1]._M_parent;
        if (iVar5 == 2) {
          get_bv_identifier_abi_cxx11_(&local_58,this,iVar6);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x117c81);
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_78.field_2._M_allocated_capacity = *psVar12;
            local_78.field_2._8_8_ = puVar10[3];
            local_78._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_78.field_2._M_allocated_capacity = *psVar12;
            local_78._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_78._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_78);
LAB_0010cc8a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar4) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        else {
          if (iVar5 == 1) {
            get_bv_identifier_abi_cxx11_(&local_58,this,iVar6);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x117135);
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78.field_2._8_8_ = puVar10[3];
              local_78._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_78._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_78);
            goto LAB_0010cc8a;
          }
          if (iVar5 == 0) {
            get_bv_identifier_abi_cxx11_(&local_58,this,iVar6);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x117c81);
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78.field_2._8_8_ = puVar10[3];
              local_78._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar12;
              local_78._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_78._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_78);
            goto LAB_0010cc8a;
          }
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var2);
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::update_time (int64_t k)
{
  if (current_step < k)
  {
    if (k > 0)
    {
      value_changes.push_back ("#" + std::to_string (k * 10 - 5));
      for (auto clk : clocks)
      {
        switch (clk.second)
        {
          case POSEDGE:
            value_changes.push_back ("0" + get_bv_identifier (clk.first));
            break;
          case NEGEDGE:
            value_changes.push_back ("1" + get_bv_identifier (clk.first));
            break;
          case EVENT: break;
        }
      }
    }
    value_changes.push_back ("#" + std::to_string (k * 10));
    current_step = k;
    for (auto clk : clocks)
    {
      switch (clk.second)
      {
        case POSEDGE:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
        case NEGEDGE:
          value_changes.push_back ("0" + get_bv_identifier (clk.first));
          break;
        case EVENT:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
      }
    }
  }
}